

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

TestInfo *
testing::internal::MakeAndRegisterTestInfo
          (string *test_suite_name,char *name,char *type_param,char *value_param,
          CodeLocation *code_location,TypeId fixture_class_id,SetUpTestSuiteFunc set_up_tc,
          TearDownTestSuiteFunc tear_down_tc,TestFactoryBase *factory)

{
  TestInfo *this;
  UnitTestImpl *this_00;
  allocator local_a1;
  TypeId local_a0;
  string local_98;
  string local_78;
  CodeLocation local_58;
  
  local_a0 = fixture_class_id;
  this = (TestInfo *)operator_new(0x110);
  std::__cxx11::string::string((string *)&local_78,(string *)test_suite_name);
  std::__cxx11::string::string((string *)&local_98,name,&local_a1);
  CodeLocation::CodeLocation(&local_58,code_location);
  TestInfo::TestInfo(this,&local_78,&local_98,type_param,value_param,&local_58,local_a0,factory);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  this_00 = GetUnitTestImpl();
  UnitTestImpl::AddTestInfo(this_00,set_up_tc,tear_down_tc,this);
  return this;
}

Assistant:

TestInfo* MakeAndRegisterTestInfo(
    std::string test_suite_name, const char* name, const char* type_param,
    const char* value_param, CodeLocation code_location,
    TypeId fixture_class_id, SetUpTestSuiteFunc set_up_tc,
    TearDownTestSuiteFunc tear_down_tc, TestFactoryBase* factory) {
  TestInfo* const test_info =
      new TestInfo(std::move(test_suite_name), name, type_param, value_param,
                   std::move(code_location), fixture_class_id, factory);
  GetUnitTestImpl()->AddTestInfo(set_up_tc, tear_down_tc, test_info);
  return test_info;
}